

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O0

size_t SerializeMe::BufferSize<unsigned_char>(uchar *val)

{
  uchar *val_local;
  
  return 1;
}

Assistant:

inline size_t BufferSize(const T& val)
{
  if constexpr (is_arithmetic<T>())
  {
    return sizeof(T);
  }
  else
  {
    static_assert(is_serializer_defined<T>(), "Missing specialization of class "
                                              "Serialize<>. Check errors below");

    if constexpr (is_serializer_defined<T>())
    {
      size_t total_size = 0;
      auto func = [&total_size](auto const& field) { total_size += BufferSize(field); };

      Serializer<T>().operator()(const_cast<T&>(val), func);
      return total_size;
    }
  }
}